

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O1

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::QueryResult::Fetch(QueryResult *this)

{
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var1;
  DataChunk *in_RAX;
  pointer this_00;
  pointer *__ptr;
  long *in_RSI;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (**(code **)(*in_RSI + 0x18))(&local_18);
  if (local_18._M_head_impl == (DataChunk *)0x0) {
    (this->super_BaseQueryResult)._vptr_BaseQueryResult = (_func_int **)0x0;
  }
  else {
    this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
              operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                          *)&local_18);
    DataChunk::Flatten(this_00);
    (this->super_BaseQueryResult)._vptr_BaseQueryResult = (_func_int **)local_18._M_head_impl;
    local_18._M_head_impl = (DataChunk *)0x0;
  }
  _Var1._M_head_impl = local_18._M_head_impl;
  if (local_18._M_head_impl != (DataChunk *)0x0) {
    DataChunk::~DataChunk(local_18._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> QueryResult::Fetch() {
	auto chunk = FetchRaw();
	if (!chunk) {
		return nullptr;
	}
	chunk->Flatten();
	return chunk;
}